

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O3

void CMU462::make_coord_space(Matrix3x3 *o2w,Vector3D *n)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  Vector3D *pVVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dStack_60;
  
  dVar11 = n->x;
  dVar3 = n->y;
  dVar2 = n->z;
  dVar5 = ABS(dVar11);
  dVar10 = ABS(dVar3);
  dVar7 = dVar2;
  dVar6 = dVar3;
  if ((dVar10 < dVar5) || (ABS(dVar2) < dVar5)) {
    dVar8 = dVar11;
    if ((dVar5 < dVar10) || (ABS(dVar2) < dVar10)) {
      dVar7 = 1.0;
    }
    else {
      dVar6 = 1.0;
    }
  }
  else {
    dVar8 = 1.0;
  }
  dVar5 = 1.0 / SQRT(dVar2 * dVar2 + dVar11 * dVar11 + dVar3 * dVar3);
  dVar11 = dVar11 * dVar5;
  auVar1._8_4_ = SUB84(dVar7,0);
  auVar1._0_8_ = dVar6;
  auVar1._12_4_ = (int)((ulong)dVar7 >> 0x20);
  pVVar4 = Matrix3x3::operator[](o2w,0);
  dVar3 = dVar5 * dVar3;
  dVar5 = dVar5 * dVar2;
  dVar7 = dVar7 * dVar11 - dVar5 * dVar8;
  dStack_60 = auVar1._8_8_;
  dVar9 = dVar8 * dVar3 - dVar11 * dVar6;
  dVar10 = dVar6 * dVar5 - dVar3 * dStack_60;
  dVar12 = 1.0 / SQRT(dVar9 * dVar9 + dVar10 * dVar10 + dVar7 * dVar7);
  dVar7 = dVar7 * dVar12;
  dVar9 = dVar12 * dVar9;
  dVar12 = dVar12 * dVar10;
  dVar10 = dVar3 * dVar9 - dVar7 * dVar5;
  dVar2 = dVar5 * dVar12 - dVar9 * dVar11;
  dVar6 = dVar11 * dVar7 - dVar12 * dVar3;
  dVar8 = 1.0 / SQRT(dVar6 * dVar6 + dVar10 * dVar10 + dVar2 * dVar2);
  pVVar4->x = dVar8 * dVar10;
  pVVar4->y = dVar8 * dVar2;
  pVVar4->z = dVar6 * dVar8;
  pVVar4 = Matrix3x3::operator[](o2w,1);
  pVVar4->x = dVar12;
  pVVar4->y = dVar7;
  pVVar4->z = dVar9;
  pVVar4 = Matrix3x3::operator[](o2w,2);
  pVVar4->x = dVar11;
  pVVar4->y = dVar3;
  pVVar4->z = dVar5;
  return;
}

Assistant:

void make_coord_space(Matrix3x3& o2w, const Vector3D& n) {

    Vector3D z = Vector3D(n.x, n.y, n.z);
    Vector3D h = z;
    if (fabs(h.x) <= fabs(h.y) && fabs(h.x) <= fabs(h.z)) h.x = 1.0;
    else if (fabs(h.y) <= fabs(h.x) && fabs(h.y) <= fabs(h.z)) h.y = 1.0;
    else h.z = 1.0;

    z.normalize();
    Vector3D y = cross(h, z);
    y.normalize();
    Vector3D x = cross(z, y);
    x.normalize();

    o2w[0] = x;
    o2w[1] = y;
    o2w[2] = z;
  }